

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O0

ExpectedRef<const_Mapping,_std::string> * __thiscall
yaml::Value::getMapping_abi_cxx11_
          (ExpectedRef<const_Mapping,_std::string> *__return_storage_ptr__,Value *this)

{
  reference_wrapper<const_yaml::Mapping> local_78 [3];
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  if (this->type_ == Mapping) {
    local_78[0] = std::cref<yaml::Mapping>(&this->mapping_);
    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,local_78);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Value is not of Mapping type",&local_59);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_38,&local_58);
    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_38);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpectedRef<const Mapping, std::string> getMapping() const {
		if (type_ != Type::Mapping)
			return Unexpected<std::string>("Value is not of Mapping type");
		return std::cref(mapping_);
	}